

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.h
# Opt level: O0

void __thiscall Refal2::CQualifierBuilder::CQualifierBuilder(CQualifierBuilder *this)

{
  CQualifierBuilder *this_local;
  
  CSetBuilder<char>::CSetBuilder(&this->charsBuilder);
  CSetBuilder<int>::CSetBuilder(&this->labelsBuilder);
  CSetBuilder<unsigned_int>::CSetBuilder(&this->numbersBuilder);
  std::bitset<128UL>::bitset(&this->ansichars);
  std::bitset<128UL>::bitset(&this->ansicharsFixed);
  Reset(this);
  return;
}

Assistant:

CQualifierBuilder()	{ Reset(); }